

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

void __thiscall flow::lang::Lexer::openString(Lexer *this,string *content)

{
  allocator<char> local_49;
  basic_istream<char,_std::char_traits<char>_> *local_48;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> local_40;
  string local_38;
  
  std::make_unique<std::__cxx11::stringstream>();
  std::operator<<((ostream *)(local_48 + 0x10),(string *)content);
  local_40._M_head_impl = local_48;
  local_48 = (basic_istream<char,_std::char_traits<char>_> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"<string>",&local_49);
  openStream(this,(unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                   *)&local_40,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (local_40._M_head_impl != (basic_istream<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)local_40._M_head_impl + 8))();
  }
  if (local_48 != (basic_istream<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)local_48 + 8))();
  }
  return;
}

Assistant:

void Lexer::openString(const std::string& content) {
  auto sstr = std::make_unique<std::stringstream>();
  (*sstr) << content;
  openStream(std::move(sstr), "<string>");
}